

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O3

void __thiscall Js::ScriptContext::InitializeCache(ScriptContext *this)

{
  Type *addr;
  Type *addr_00;
  Type *addr_01;
  Type *addr_02;
  JavascriptLibrary *pJVar1;
  bool bVar2;
  Recycler *pRVar3;
  SListNodeBase<Memory::Recycler> addr_03;
  MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>
  *pMVar4;
  SourceContextInfo *pSVar5;
  SRCINFO *addr_04;
  int mruListCapacity;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  bVar2 = DynamicProfileInfo::NeedProfileInfoList();
  if (bVar2) {
    local_58 = (undefined1  [8])
               &SListBase<Js::DynamicProfileInfo*,Memory::Recycler,RealCount>::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_2d7f97f;
    data.filename._0_4_ = 0x4f8;
    pRVar3 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_58);
    addr_03.next.ptr = (Type)new<Memory::Recycler>(0x10,pRVar3,0x387914);
    *(Type *)addr_03.next.ptr = (Type)0x0;
    ((RealCount *)((long)addr_03.next.ptr + 8))->count = 0;
    Memory::Recycler::WBSetBit((char *)addr_03.next.ptr);
    *(Type *)addr_03.next.ptr = addr_03.next.ptr;
    Memory::RecyclerWriteBarrierManager::WriteBarrier((void *)addr_03.next.ptr);
    *(undefined4 *)((long)addr_03.next.ptr + 8) = 0;
    pJVar1 = (this->super_ScriptContextBase).javascriptLibrary;
    addr_01 = &(pJVar1->cache).profileInfoList;
    Memory::Recycler::WBSetBit((char *)addr_01);
    (pJVar1->cache).profileInfoList.ptr =
         (SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount> *)addr_03.next.ptr;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_01);
  }
  memset(&((this->super_ScriptContextBase).javascriptLibrary)->cache,0,0x280);
  mruListCapacity = 0x10;
  if (0 < DAT_015bc480) {
    mruListCapacity = DAT_015bc480;
  }
  pMVar4 = JsUtil::
           MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>
           ::New(this->recycler,mruListCapacity);
  pJVar1 = (this->super_ScriptContextBase).javascriptLibrary;
  addr_02 = &(pJVar1->cache).dynamicRegexMap;
  Memory::Recycler::WBSetBit((char *)addr_02);
  (pJVar1->cache).dynamicRegexMap.ptr = pMVar4;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_02);
  local_58 = (undefined1  [8])&SourceContextInfo::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_2d7f97f;
  data.filename._0_4_ = 0x503;
  pRVar3 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_58);
  pSVar5 = (SourceContextInfo *)new<Memory::Recycler>(0x38,pRVar3,0x56b216);
  (pSVar5->sourceDynamicProfileManager).ptr = (SourceDynamicProfileManager *)0x0;
  pSVar5->dwHostSourceContext = 0xffffffffffffffff;
  pSVar5->isHostDynamicDocument = false;
  pSVar5->sourceContextId = 0xffffffff;
  pJVar1 = (this->super_ScriptContextBase).javascriptLibrary;
  addr = &(pJVar1->cache).noContextSourceContextInfo;
  Memory::Recycler::WBSetBit((char *)addr);
  (pJVar1->cache).noContextSourceContextInfo.ptr = pSVar5;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  local_58 = (undefined1  [8])&SRCINFO::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_2d7f97f;
  data.filename._0_4_ = 0x509;
  pRVar3 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_58);
  addr_04 = (SRCINFO *)new<Memory::Recycler>(0x28,pRVar3,0x56b216);
  (addr_04->sourceContextInfo).ptr = (SourceContextInfo *)0x0;
  pSVar5 = (((this->super_ScriptContextBase).javascriptLibrary)->cache).noContextSourceContextInfo.
           ptr;
  Memory::Recycler::WBSetBit((char *)addr_04);
  (addr_04->sourceContextInfo).ptr = pSVar5;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_04);
  addr_04->moduleID = 0;
  pJVar1 = (this->super_ScriptContextBase).javascriptLibrary;
  addr_00 = &(pJVar1->cache).noContextGlobalSourceInfo;
  Memory::Recycler::WBSetBit((char *)addr_00);
  (pJVar1->cache).noContextGlobalSourceInfo.ptr = addr_04;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_00);
  return;
}

Assistant:

void ScriptContext::InitializeCache()
    {

#if ENABLE_PROFILE_INFO
#if DBG_DUMP || defined(DYNAMIC_PROFILE_STORAGE) || defined(RUNTIME_DATA_COLLECTION)
        if (DynamicProfileInfo::NeedProfileInfoList())
        {
            this->Cache()->profileInfoList = RecyclerNew(this->GetRecycler(), DynamicProfileInfoList);
        }
#endif
#endif

        ClearArray(this->Cache()->propertyStrings, 80);
        this->Cache()->dynamicRegexMap =
            RegexPatternMruMap::New(
                recycler,
                REGEX_CONFIG_FLAG(DynamicRegexMruListSize) <= 0 ? 16 : REGEX_CONFIG_FLAG(DynamicRegexMruListSize));

        SourceContextInfo* sourceContextInfo = RecyclerNewStructZ(this->GetRecycler(), SourceContextInfo);
        sourceContextInfo->dwHostSourceContext = Js::Constants::NoHostSourceContext;
        sourceContextInfo->isHostDynamicDocument = false;
        sourceContextInfo->sourceContextId = Js::Constants::NoSourceContext;
        this->Cache()->noContextSourceContextInfo = sourceContextInfo;

        SRCINFO* srcInfo = RecyclerNewStructZ(this->GetRecycler(), SRCINFO);
        srcInfo->sourceContextInfo = this->Cache()->noContextSourceContextInfo;
        srcInfo->moduleID = kmodGlobal;
        this->Cache()->noContextGlobalSourceInfo = srcInfo;
    }